

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-util.h
# Opt level: O0

string * __thiscall
wabt::operator+[abi_cxx11_(string *__return_storage_ptr__,wabt *this,char *x,string_view y)

{
  char *in_R9;
  string_view x_00;
  string_view y_00;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  wabt *local_28;
  char *x_local;
  string_view y_local;
  
  y_local._M_len = y._M_len;
  local_28 = this;
  x_local = x;
  y_local._M_str = (char *)__return_storage_ptr__;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_38,(char *)this);
  x_00._M_str = x_local;
  x_00._M_len = (size_t)local_38._M_str;
  y_00._M_str = in_R9;
  y_00._M_len = y_local._M_len;
  operator+[abi_cxx11_(__return_storage_ptr__,(wabt *)local_38._M_len,x_00,y_00);
  return __return_storage_ptr__;
}

Assistant:

inline std::string operator+(const char* x, std::string_view y) {
  return std::string_view(x) + y;
}